

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O0

void get_interest_points(fasthessian *fh,
                        vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  bool bVar1;
  long in_RDI;
  int c;
  int r;
  int i;
  int o;
  response_layer *top;
  response_layer *middle;
  response_layer *bottom;
  int filter_map [3] [4];
  vector<interest_point,_std::allocator<interest_point>_> *in_stack_000000b0;
  response_layer *in_stack_000000b8;
  response_layer *in_stack_000000c0;
  response_layer *in_stack_000000c8;
  int in_stack_000000d0;
  int in_stack_000000d4;
  int local_70;
  int local_6c;
  int local_68;
  float thresh;
  response_layer *bottom_00;
  response_layer *middle_00;
  response_layer *top_00;
  int local_48;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  
  memcpy(&local_48,&DAT_001c7030,0x30);
  for (thresh = 0.0; (int)thresh < *(int *)(in_RDI + 0x48); thresh = (float)((int)thresh + 1)) {
    for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
      top_00 = *(response_layer **)
                (in_RDI + 8 + (long)(&local_48)[(long)(int)thresh * 4 + (long)local_68] * 8);
      middle_00 = *(response_layer **)
                   (in_RDI + 8 + (long)(&local_48)[(long)(int)thresh * 4 + (long)(local_68 + 1)] * 8
                   );
      bottom_00 = *(response_layer **)
                   (in_RDI + 8 + (long)(&local_48)[(long)(int)thresh * 4 + (long)(local_68 + 2)] * 8
                   );
      for (local_6c = 0; local_6c < bottom_00->height; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < bottom_00->width; local_70 = local_70 + 1) {
          bVar1 = is_extremum(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,top_00,middle_00,
                              bottom_00,thresh);
          if (bVar1) {
            interpolate_extremum
                      (in_stack_000000d4,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                       in_stack_000000b8,in_stack_000000b0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void get_interest_points(struct fasthessian *fh, std::vector<struct interest_point> *interest_points) {

    assert(fh != NULL);
    assert(interest_points != NULL);

    // filter index map
    const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
        {0, 1, 2, 3},
        {1, 3, 4, 5},
        {3, 5, 6, 7},
        //{5, 7, 8, 9},
        //{7, 9, 10, 11}
    };

    // getting response layers
    struct response_layer *bottom;
    struct response_layer *middle;
    struct response_layer *top;

    // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
    for (int o = 0; o < fh->octaves; ++o) {

        // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
        for (int i = 0; i <= 1; ++i) {

            // assigning respective bottom, middle and top response layer
            bottom = fh->response_map[filter_map[o][i]];
            middle = fh->response_map[filter_map[o][i+1]];
            top = fh->response_map[filter_map[o][i+2]];

            // iterating over middle response layer at density of the most sparse layer (always top),
            // to find maxima accreoss scale and space
            for (int r = 0; r < top->height; ++r) {
                for (int c = 0; c < top->width; ++c) {

                    // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                    if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {

                        // sub-pixel interpolating local maxium and adding to resulting interest point vector
                        interpolate_extremum(r, c, top, middle, bottom, interest_points);

                    }

                }
            }

        }
    }

}